

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BorderAmounts_EdgeSizes::Clear(BorderAmounts_EdgeSizes *this)

{
  uint32_t cached_has_bits;
  BorderAmounts_EdgeSizes *this_local;
  
  memset(&this->startedgesize_,0,0x10);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BorderAmounts_EdgeSizes::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&startedgesize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&endedgesize_) -
      reinterpret_cast<char*>(&startedgesize_)) + sizeof(endedgesize_));
  _internal_metadata_.Clear<std::string>();
}